

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O3

int __thiscall amrex::ParmParse::countname(ParmParse *this,string *name)

{
  _List_node_base *p_Var1;
  _Alloc_hider _Var2;
  int iVar3;
  uint uVar4;
  int iVar5;
  _List_node_base *p_Var6;
  string local_50;
  
  p_Var1 = (_List_node_base *)this->m_table;
  p_Var6 = p_Var1->_M_next;
  if (p_Var6 == p_Var1) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    do {
      prefixedName(&local_50,this,name);
      _Var2._M_p = local_50._M_dataplus._M_p;
      uVar4 = 0;
      if ((p_Var6[4]._M_prev == (_List_node_base *)0x0) &&
         (p_Var6[1]._M_prev == (_List_node_base *)local_50._M_string_length)) {
        if ((_List_node_base *)local_50._M_string_length == (_List_node_base *)0x0) {
          uVar4 = 1;
        }
        else {
          iVar3 = bcmp(local_50._M_dataplus._M_p,p_Var6[1]._M_next,local_50._M_string_length);
          uVar4 = (uint)(iVar3 == 0);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != &local_50.field_2) {
        operator_delete(_Var2._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      iVar5 = iVar5 + uVar4;
      p_Var6 = (((_List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                  *)&p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var6 != p_Var1);
  }
  return iVar5;
}

Assistant:

int
ParmParse::countname (const std::string& name) const
{
    int cnt = 0;
    for ( const_list_iterator li = m_table.begin(), End = m_table.end(); li != End; ++li )
    {
        if ( ppfound(prefixedName(name), *li, false) )
        {
            cnt++;
        }
    }
    return cnt;
}